

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdGetBaseTapLeaf(void *handle,void *tree_handle,uint8_t *leaf_version,char **tapscript,
                     char **tap_leaf_hash)

{
  bool bVar1;
  uint8_t uVar2;
  reference this;
  undefined8 *in_RCX;
  uint8_t *in_RDX;
  long in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  value_type *tree;
  value_type *branch;
  CfdCapiTapscriptTree *buffer;
  char *work_tap_leaf_hash;
  char *work_tapscript;
  int result;
  size_type in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  string *message;
  ByteData256 local_1b8;
  string local_1a0;
  Script local_180;
  string local_148;
  string *in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee0;
  string local_108;
  Script local_e8;
  string local_b0;
  TapBranch *local_90;
  long local_88;
  undefined1 local_79 [49];
  char *local_48;
  char *local_40;
  undefined4 local_34;
  undefined8 *local_30;
  undefined8 *local_28;
  uint8_t *local_20;
  long local_18;
  
  local_34 = 0xffffffff;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  message = (string *)local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_79 + 1),"TapscriptTree",(allocator *)message);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string((string *)(local_79 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_79);
  local_88 = local_18;
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_18 + 0x18));
  if (bVar1) {
    this = std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
           ::at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                 *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                in_stack_fffffffffffffdc8);
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::TapBranch::GetScript(&local_180,&this->super_TapBranch);
      cfd::core::Script::GetHex_abi_cxx11_(&local_148,&local_180);
      local_40 = cfd::capi::CreateString(message);
      std::__cxx11::string::~string((string *)&local_148);
      cfd::core::Script::~Script
                ((Script *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    }
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::TaprootScriptTree::GetTapLeafHash(&local_1b8,this);
      cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1a0,&local_1b8);
      local_48 = cfd::capi::CreateString(message);
      std::__cxx11::string::~string((string *)&local_1a0);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x59c53d);
    }
    if (local_20 != (uint8_t *)0x0) {
      uVar2 = cfd::core::TapBranch::GetLeafVersion(&this->super_TapBranch);
      *local_20 = uVar2;
    }
  }
  else {
    local_90 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                         ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                          CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                          in_stack_fffffffffffffdc8);
    bVar1 = cfd::core::TapBranch::HasTapLeaf(local_90);
    if (bVar1) {
      if (local_28 != (undefined8 *)0x0) {
        cfd::core::TapBranch::GetScript(&local_e8,local_90);
        cfd::core::Script::GetHex_abi_cxx11_(&local_b0,&local_e8);
        local_40 = cfd::capi::CreateString(message);
        std::__cxx11::string::~string((string *)&local_b0);
        cfd::core::Script::~Script
                  ((Script *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      }
      if (local_20 != (uint8_t *)0x0) {
        uVar2 = cfd::core::TapBranch::GetLeafVersion(local_90);
        *local_20 = uVar2;
      }
    }
    else if (local_20 != (uint8_t *)0x0) {
      *local_20 = '\0';
    }
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::TapBranch::GetBaseHash((ByteData256 *)&stack0xfffffffffffffee0,local_90);
      cfd::core::ByteData256::GetHex_abi_cxx11_(&local_108,(ByteData256 *)&stack0xfffffffffffffee0);
      local_48 = cfd::capi::CreateString(message);
      std::__cxx11::string::~string((string *)&local_108);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x59c389);
    }
  }
  if (local_28 != (undefined8 *)0x0) {
    *local_28 = local_40;
  }
  if (local_30 != (undefined8 *)0x0) {
    *local_30 = local_48;
  }
  return 0;
}

Assistant:

int CfdGetBaseTapLeaf(
    void* handle, void* tree_handle, uint8_t* leaf_version, char** tapscript,
    char** tap_leaf_hash) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_tapscript = nullptr;
  char* work_tap_leaf_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.HasTapLeaf()) {
        if (tapscript != nullptr) {
          work_tapscript = CreateString(branch.GetScript().GetHex());
        }
        if (leaf_version != nullptr) *leaf_version = branch.GetLeafVersion();
      } else {
        if (leaf_version != nullptr) *leaf_version = 0;
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(branch.GetBaseHash().GetHex());
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      if (tapscript != nullptr) {
        work_tapscript = CreateString(tree.GetScript().GetHex());
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(tree.GetTapLeafHash().GetHex());
      }
      if (leaf_version != nullptr) *leaf_version = tree.GetLeafVersion();
    }

    if (tapscript != nullptr) *tapscript = work_tapscript;
    if (tap_leaf_hash != nullptr) *tap_leaf_hash = work_tap_leaf_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_tapscript, &work_tap_leaf_hash);
  return result;
}